

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::detail::BufferStream::~BufferStream(BufferStream *this)

{
  BufferStream *this_local;
  
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__BufferStream_001cb4d0;
  std::__cxx11::string::~string((string *)&this->buffer);
  Stream::~Stream(&this->super_Stream);
  return;
}

Assistant:

~BufferStream() override = default;